

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

int js_os_init(JSContext *ctx,JSModuleDef *m)

{
  JSValue obj_00;
  JSValue obj_01;
  JSValue func_obj;
  JSValue val;
  JSValue this_obj;
  JSValue new_target;
  int iVar1;
  JSRuntime *rt_00;
  void *pvVar2;
  JSCFunctionListEntry *in_RSI;
  JSContext *in_RDI;
  JSValue JVar3;
  JSValue JVar4;
  JSContext *unaff_retaddr;
  JSValue obj;
  JSValue proto;
  JSThreadState *ts;
  JSRuntime *rt;
  JSClassID in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  JSCFunctionEnum in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  JSClassID in_stack_ffffffffffffff84;
  JSValueUnion in_stack_ffffffffffffff88;
  JSValueUnion in_stack_ffffffffffffff90;
  JSValueUnion in_stack_ffffffffffffff98;
  JSValueUnion JVar5;
  JSWorkerMessagePipe *local_58;
  JSValueUnion ctx_00;
  JSValueUnion local_48;
  JSValueUnion send_pipe;
  
  os_poll_func = js_os_poll;
  JS_NewClassID(&js_os_timer_class_id);
  JS_GetRuntime(in_RDI);
  JS_NewClass((JSRuntime *)in_stack_ffffffffffffff88.ptr,in_stack_ffffffffffffff84,
              (JSClassDef *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  rt_00 = JS_GetRuntime(in_RDI);
  pvVar2 = JS_GetRuntimeOpaque(rt_00);
  iVar1 = (int)((ulong)rt_00 >> 0x20);
  JS_NewClassID(&js_worker_class_id);
  JS_GetRuntime(in_RDI);
  JS_NewClass((JSRuntime *)in_stack_ffffffffffffff88.ptr,in_stack_ffffffffffffff84,
              (JSClassDef *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  JVar3 = JS_NewObject((JSContext *)0x10d5f5);
  ctx_00 = JVar3.u;
  local_48 = (JSValueUnion)JVar3.tag;
  obj_01.tag = (int64_t)in_stack_ffffffffffffff90.ptr;
  obj_01.u.ptr = in_stack_ffffffffffffff88.ptr;
  JS_SetPropertyFunctionList
            ((JSContext *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),obj_01,
             (JSCFunctionListEntry *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff74);
  JVar4 = JS_NewCFunction2((JSContext *)in_stack_ffffffffffffff90.ptr,
                           (JSCFunction *)in_stack_ffffffffffffff88.ptr,
                           (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff74);
  JVar5 = JVar4.u;
  local_58 = (JSWorkerMessagePipe *)JVar4.tag;
  func_obj.tag = (int64_t)in_stack_ffffffffffffff90.ptr;
  func_obj.u.ptr = in_stack_ffffffffffffff88.ptr;
  JVar4.u._4_4_ = in_stack_ffffffffffffff7c;
  JVar4.u.int32 = in_stack_ffffffffffffff78;
  JVar4.tag._0_4_ = in_stack_ffffffffffffff80;
  JVar4.tag._4_4_ = in_stack_ffffffffffffff84;
  send_pipe = JVar5;
  JS_SetConstructor((JSContext *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    func_obj,JVar4);
  obj_00.u._4_4_ = in_stack_ffffffffffffff7c;
  obj_00.u.int32 = in_stack_ffffffffffffff78;
  obj_00.tag._0_4_ = in_stack_ffffffffffffff80;
  obj_00.tag._4_4_ = in_stack_ffffffffffffff84;
  JS_SetClassProto((JSContext *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff6c,obj_00);
  if ((*(long *)((long)pvVar2 + 0x48) != 0) && (*(long *)((long)pvVar2 + 0x50) != 0)) {
    in_stack_ffffffffffffff78 = (JSCFunctionEnum)in_RDI;
    in_stack_ffffffffffffff7c = (int)((ulong)in_RDI >> 0x20);
    in_stack_ffffffffffffff80 = 0;
    in_stack_ffffffffffffff88.float64 = 1.48219693752374e-323;
    new_target.tag = (int64_t)pvVar2;
    new_target.u.float64 = local_48.float64;
    JVar4 = js_worker_ctor_internal
                      ((JSContext *)ctx_00.ptr,new_target,local_58,
                       (JSWorkerMessagePipe *)send_pipe.ptr);
    in_stack_ffffffffffffff90 = JVar4.u;
    in_stack_ffffffffffffff98 = (JSValueUnion)JVar4.tag;
    this_obj.tag = (int64_t)JVar5.ptr;
    this_obj.u.ptr = in_stack_ffffffffffffff98.ptr;
    val.tag = (int64_t)in_stack_ffffffffffffff90.ptr;
    val.u.float64 = in_stack_ffffffffffffff88.float64;
    JS_DefinePropertyValueStr
              ((JSContext *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),this_obj,
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),val,
               JVar3.u._0_4_);
  }
  JVar3.tag = (int64_t)in_stack_ffffffffffffff98.ptr;
  JVar3.u.ptr = in_stack_ffffffffffffff90.ptr;
  JS_SetModuleExport((JSContext *)in_stack_ffffffffffffff88.ptr,
                     (JSModuleDef *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),JVar3);
  iVar1 = JS_SetModuleExportList(unaff_retaddr,(JSModuleDef *)in_RDI,in_RSI,iVar1);
  return iVar1;
}

Assistant:

static int js_os_init(JSContext *ctx, JSModuleDef *m)
{
    os_poll_func = js_os_poll;
    
    /* OSTimer class */
    JS_NewClassID(&js_os_timer_class_id);
    JS_NewClass(JS_GetRuntime(ctx), js_os_timer_class_id, &js_os_timer_class);

#ifdef USE_WORKER
    {
        JSRuntime *rt = JS_GetRuntime(ctx);
        JSThreadState *ts = JS_GetRuntimeOpaque(rt);
        JSValue proto, obj;
        /* Worker class */
        JS_NewClassID(&js_worker_class_id);
        JS_NewClass(JS_GetRuntime(ctx), js_worker_class_id, &js_worker_class);
        proto = JS_NewObject(ctx);
        JS_SetPropertyFunctionList(ctx, proto, js_worker_proto_funcs, countof(js_worker_proto_funcs));
        
        obj = JS_NewCFunction2(ctx, js_worker_ctor, "Worker", 1,
                               JS_CFUNC_constructor, 0);
        JS_SetConstructor(ctx, obj, proto);
        
        JS_SetClassProto(ctx, js_worker_class_id, proto);
        
        /* set 'Worker.parent' if necessary */
        if (ts->recv_pipe && ts->send_pipe) {
            JS_DefinePropertyValueStr(ctx, obj, "parent",
                                      js_worker_ctor_internal(ctx, JS_UNDEFINED, ts->recv_pipe, ts->send_pipe),
                                      JS_PROP_C_W_E);
        }
        
        JS_SetModuleExport(ctx, m, "Worker", obj);
    }
#endif /* USE_WORKER */

    return JS_SetModuleExportList(ctx, m, js_os_funcs,
                                  countof(js_os_funcs));
}